

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# setup_common.cpp
# Opt level: O0

void __thiscall TestChain100Setup::mineBlocks(TestChain100Setup *this,int num_blocks)

{
  long lVar1;
  span<const_unsigned_char,_18446744073709551615UL> b_00;
  vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *this_00;
  int in_ESI;
  vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *in_RDI;
  long in_FS_OFFSET;
  int i;
  vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> noTxns;
  CBlock b;
  CScript scriptPubKey;
  CBlock *in_stack_fffffffffffffe68;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *in_stack_fffffffffffffe70;
  pointer *__x;
  span<const_unsigned_char,_18446744073709551615UL> *in_stack_fffffffffffffe78;
  CScript *in_stack_fffffffffffffe88;
  CKey *in_stack_fffffffffffffe90;
  undefined4 in_stack_fffffffffffffea0;
  int iVar2;
  undefined4 in_stack_fffffffffffffea4;
  __extent_storage<18446744073709551615UL> in_stack_fffffffffffffea8;
  undefined4 in_stack_fffffffffffffeb0;
  vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *txns;
  TestChain100Setup *in_stack_fffffffffffffec0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  txns = in_RDI;
  CScript::CScript((CScript *)in_stack_fffffffffffffe68);
  CKey::GetPubKey(in_stack_fffffffffffffe90);
  ToByteVector<CPubKey>((CPubKey *)in_stack_fffffffffffffea8._M_extent_value);
  std::span<const_unsigned_char,_18446744073709551615UL>::
  span<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
            (in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
  b_00._M_ptr._4_4_ = in_stack_fffffffffffffea4;
  b_00._M_ptr._0_4_ = in_stack_fffffffffffffea0;
  b_00._M_extent._M_extent_value = in_stack_fffffffffffffea8._M_extent_value;
  CScript::operator<<(in_stack_fffffffffffffe88,b_00);
  CScript::operator<<((CScript *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                      (opcodetype)((ulong)in_RDI >> 0x20));
  CScript::CScript((CScript *)in_stack_fffffffffffffe68,(CScript *)0xea906c);
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)in_stack_fffffffffffffe78);
  CScript::~CScript((CScript *)in_stack_fffffffffffffe68);
  for (iVar2 = 0; iVar2 < in_ESI; iVar2 = iVar2 + 1) {
    std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::vector
              ((vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)
               in_stack_fffffffffffffe68);
    CreateAndProcessBlock
              (in_stack_fffffffffffffec0,txns,(CScript *)CONCAT44(in_ESI,in_stack_fffffffffffffeb0),
               (Chainstate *)in_stack_fffffffffffffea8._M_extent_value);
    this_00 = (vector<CMutableTransaction,_std::allocator<CMutableTransaction>_> *)GetTime();
    SetMockTime((int64_t)in_stack_fffffffffffffe68);
    __x = &in_RDI[0x30].
           super__Vector_base<CMutableTransaction,_std::allocator<CMutableTransaction>_>._M_impl.
           super__Vector_impl_data._M_finish;
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::operator[]((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                  *)this_00,(size_type)__x);
    std::
    vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
    ::push_back((vector<std::shared_ptr<const_CTransaction>,_std::allocator<std::shared_ptr<const_CTransaction>_>_>
                 *)this_00,(value_type *)__x);
    CBlock::~CBlock(in_stack_fffffffffffffe68);
    std::vector<CMutableTransaction,_std::allocator<CMutableTransaction>_>::~vector(this_00);
  }
  CScript::~CScript((CScript *)in_stack_fffffffffffffe68);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void TestChain100Setup::mineBlocks(int num_blocks)
{
    CScript scriptPubKey = CScript() << ToByteVector(coinbaseKey.GetPubKey()) << OP_CHECKSIG;
    for (int i = 0; i < num_blocks; i++) {
        std::vector<CMutableTransaction> noTxns;
        CBlock b = CreateAndProcessBlock(noTxns, scriptPubKey);
        SetMockTime(GetTime() + 1);
        m_coinbase_txns.push_back(b.vtx[0]);
    }
}